

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O0

void unodb::detail::ensure_capacity(byte **buf,size_t *cap,size_t off,size_t min_capacity)

{
  byte *__dest;
  size_t local_48;
  void *tmp;
  unsigned_long asize;
  type_conflict1 nsize;
  size_t min_capacity_local;
  size_t off_local;
  size_t *cap_local;
  byte **buf_local;
  
  local_48 = next_power_of_two<unsigned_long>(min_capacity);
  if (min_capacity == local_48 >> 1) {
    local_48 = min_capacity;
  }
  __dest = (byte *)allocate_aligned(local_48,0x10);
  memcpy(__dest,*buf,off);
  if (0x100 < *cap) {
    free_aligned(*buf);
  }
  *buf = __dest;
  *cap = local_48;
  return;
}

Assistant:

inline void ensure_capacity(std::byte *&buf, size_t &cap, size_t off,
                            size_t min_capacity) {
  // Find the allocation size in bytes which satisfies that minimum capacity.
  // We first look for the next power of two.  Then we adjust for the case where
  // the [min_capacity] is already a power of two (a common edge case).
  auto nsize = detail::next_power_of_two(min_capacity);
  auto asize = (min_capacity == (nsize >> 1U)) ? min_capacity : nsize;
  auto *tmp = detail::allocate_aligned(asize);  // new allocation.
  std::memcpy(tmp, buf, off);                   // copy over the data.
  if (cap > INITIAL_BUFFER_CAPACITY) {          // free old buffer iff allocated
    detail::free_aligned(buf);
  }
  buf = static_cast<std::byte *>(tmp);
  cap = asize;
}